

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerSettings.cpp
# Opt level: O3

bool __thiscall AtmelSWIAnalyzerSettings::SetSettingsFromInterfaces(AtmelSWIAnalyzerSettings *this)

{
  byte bVar1;
  double dVar2;
  Channel local_40 [16];
  Channel local_30 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator==(local_40,local_30);
  Channel::~Channel(local_30);
  Channel::~Channel(local_40);
  if (bVar1 == 0) {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::operator=(&this->mSDAChannel,local_40);
    Channel::~Channel(local_40);
    dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mDecodeLevel = (int)dVar2;
    AnalyzerSettings::ClearChannels();
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSDAChannel,true);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool AtmelSWIAnalyzerSettings::SetSettingsFromInterfaces()
{
    if( mSDAChannelInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the SDA channel." );
        return false;
    }

    mSDAChannel = mSDAChannelInterface.GetChannel();
    mDecodeLevel = static_cast<DecodeLevel>( static_cast<int>( mDecodeLevelInterface.GetNumber() ) );

    ClearChannels();

    AddChannel( mSDAChannel, CHANNEL_NAME, true );

    return true;
}